

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O2

double highwayhash::NominalClockRate(void)

{
  uint *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  allocator<char> local_91;
  double local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [4];
  undefined4 auStack_74 [3];
  char brand_string [49];
  
  if ((NominalClockRate()::cycles_per_second == '\0') &&
     (iVar6 = __cxa_guard_acquire(&NominalClockRate()::cycles_per_second), iVar6 != 0)) {
    puVar1 = (uint *)cpuid(0x80000000);
    if (*puVar1 < 0x80000004) {
      local_88 = local_78;
      local_80 = 0;
      local_78[0] = 0;
    }
    else {
      iVar6 = -0x7ffffffe;
      for (lVar8 = 0xc; lVar8 != 0x3c; lVar8 = lVar8 + 0x10) {
        if (iVar6 == 0) {
          puVar2 = (undefined4 *)cpuid_basic_info(0);
        }
        else if (iVar6 == 1) {
          puVar2 = (undefined4 *)cpuid_Version_info(1);
        }
        else if (iVar6 == 2) {
          puVar2 = (undefined4 *)cpuid_cache_tlb_info(2);
        }
        else if (iVar6 == 3) {
          puVar2 = (undefined4 *)cpuid_serial_info(3);
        }
        else if (iVar6 == 4) {
          puVar2 = (undefined4 *)cpuid_Deterministic_Cache_Parameters_info(4);
        }
        else if (iVar6 == 5) {
          puVar2 = (undefined4 *)cpuid_MONITOR_MWAIT_Features_info(5);
        }
        else if (iVar6 == 6) {
          puVar2 = (undefined4 *)cpuid_Thermal_Power_Management_info(6);
        }
        else if (iVar6 == 7) {
          puVar2 = (undefined4 *)cpuid_Extended_Feature_Enumeration_info(7);
        }
        else if (iVar6 == 9) {
          puVar2 = (undefined4 *)cpuid_Direct_Cache_Access_info(9);
        }
        else if (iVar6 == 10) {
          puVar2 = (undefined4 *)cpuid_Architectural_Performance_Monitoring_info(10);
        }
        else if (iVar6 == 0xb) {
          puVar2 = (undefined4 *)cpuid_Extended_Topology_info(0xb);
        }
        else if (iVar6 == 0xd) {
          puVar2 = (undefined4 *)cpuid_Processor_Extended_States_info(0xd);
        }
        else if (iVar6 == 0xf) {
          puVar2 = (undefined4 *)cpuid_Quality_of_Service_info(0xf);
        }
        else if (iVar6 == -0x7ffffffe) {
          puVar2 = (undefined4 *)cpuid_brand_part1_info(0x80000002);
        }
        else if (iVar6 == -0x7ffffffd) {
          puVar2 = (undefined4 *)cpuid_brand_part2_info(0x80000003);
        }
        else if (iVar6 == -0x7ffffffc) {
          puVar2 = (undefined4 *)cpuid_brand_part3_info(0x80000004);
        }
        else {
          puVar2 = (undefined4 *)cpuid(iVar6);
        }
        uVar3 = puVar2[1];
        uVar4 = puVar2[2];
        uVar5 = puVar2[3];
        *(undefined4 *)((long)auStack_74 + lVar8) = *puVar2;
        *(undefined4 *)((long)auStack_74 + lVar8 + 4) = uVar3;
        *(undefined4 *)((long)auStack_74 + lVar8 + 8) = uVar5;
        *(undefined4 *)(brand_string + lVar8) = uVar4;
        iVar6 = iVar6 + 1;
      }
      brand_string[0x30] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,brand_string,&local_91)
      ;
    }
    pdVar9 = (double *)&DAT_0010d7b0;
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      lVar7 = std::__cxx11::string::find
                        ((char *)&local_88,
                         (long)&DAT_0010d7a0 + (long)*(int *)((long)&DAT_0010d7a0 + lVar8));
      if ((lVar7 != -1) && (lVar7 = std::__cxx11::string::rfind((char)&local_88,0x20), lVar7 != -1))
      {
        std::__cxx11::string::substr((ulong)brand_string,(ulong)&local_88);
        local_90 = std::__cxx11::stod((string *)brand_string,(size_t *)0x0);
        local_90 = local_90 * *pdVar9;
        std::__cxx11::string::~string((string *)brand_string);
        goto LAB_0010b460;
      }
      pdVar9 = pdVar9 + 1;
    }
    local_90 = 0.0;
LAB_0010b460:
    std::__cxx11::string::~string((string *)&local_88);
    NominalClockRate::cycles_per_second = local_90;
    __cxa_guard_release(&NominalClockRate()::cycles_per_second);
  }
  return NominalClockRate::cycles_per_second;
}

Assistant:

double NominalClockRate() {
  // Thread-safe caching - this is called several times.
  static const double cycles_per_second = DetectNominalClockRate();
  return cycles_per_second;
}